

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-common.hpp
# Opt level: O0

result * __thiscall
baryonyx::itm::
solve_problem<baryonyx::itm::solver_equalities_101coeff<double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>,false>,double,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  result_type_conflict __s;
  reference pvVar4;
  result local_370;
  undefined1 local_2c8 [8];
  solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
  slv_2;
  undefined1 local_1c8 [8];
  solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
  slv_1;
  undefined1 local_c8 [8];
  solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
  slv;
  double cost_constant;
  default_cost_type<double> cost;
  random_engine rng;
  undefined1 local_40 [8];
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  int variables;
  problem *pb_local;
  context *ctx_local;
  result *ret;
  
  bVar2 = std::function::operator_cast_to_bool((function *)(this + 0x118));
  if (bVar2) {
    std::function<void_(const_baryonyx::solver_parameters_&)>::operator()
              ((function<void_(const_baryonyx::solver_parameters_&)> *)(this + 0x118),
               (solver_parameters *)this);
  }
  constraints.
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  baryonyx::result::result(__return_storage_ptr__);
  constraints.
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
       length<std::vector<baryonyx::variable_value,std::allocator<baryonyx::variable_value>>>
                 ((vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> *)
                  &(ctx->parameters).seed);
  make_merged_constraints
            ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
              *)local_40,(context *)this,(problem *)ctx);
  bVar2 = std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::empty((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                   *)local_40);
  if ((bVar2) ||
     (bVar2 = std::vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_>::
              empty((vector<baryonyx::variable_value,_std::allocator<baryonyx::variable_value>_> *)
                    &(ctx->parameters).seed), bVar2)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    dVar1 = (ctx->parameters).pushing_objective_amplifier;
    pvVar4 = std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::back
                       (&__return_storage_ptr__->solutions);
    pvVar4->value = dVar1;
  }
  else {
    __s = init_random_generator_seed((context *)this);
    std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
    linear_congruential_engine
              ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)
               &cost.linear_elements,__s);
    default_cost_type<double>::default_cost_type
              ((default_cost_type<double> *)&cost_constant,
               (objective_function *)&(ctx->parameters).delta,
               (int)constraints.
                    super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    slv.m_best._48_8_ = (ctx->parameters).pushing_objective_amplifier;
    if (*(int *)(this + 0xe4) == 1) {
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
      ::solver_functor((solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
                        *)local_c8,(context *)this,(random_engine *)&cost.linear_elements);
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
      ::operator()((result *)&slv_1.m_best.remaining_constraints,
                   (solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
                    *)local_c8,
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)local_40,
                   (int)constraints.
                        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (default_cost_type<double> *)&cost_constant,(double)slv.m_best._48_8_);
      baryonyx::result::operator=
                (__return_storage_ptr__,(result *)&slv_1.m_best.remaining_constraints);
      baryonyx::result::~result((result *)&slv_1.m_best.remaining_constraints);
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
      ::~solver_functor((solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::pnm_observer>
                         *)local_c8);
    }
    else if (*(int *)(this + 0xe4) == 2) {
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
      ::solver_functor((solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
                        *)local_1c8,(context *)this,(random_engine *)&cost.linear_elements);
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
      ::operator()((result *)&slv_2.m_best.remaining_constraints,
                   (solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
                    *)local_1c8,
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)local_40,
                   (int)constraints.
                        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (default_cost_type<double> *)&cost_constant,(double)slv.m_best._48_8_);
      baryonyx::result::operator=
                (__return_storage_ptr__,(result *)&slv_2.m_best.remaining_constraints);
      baryonyx::result::~result((result *)&slv_2.m_best.remaining_constraints);
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
      ::~solver_functor((solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::file_observer>
                         *)local_1c8);
    }
    else {
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
      ::solver_functor((solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
                        *)local_2c8,(context *)this,(random_engine *)&cost.linear_elements);
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
      ::operator()(&local_370,
                   (solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
                    *)local_2c8,
                   (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                    *)local_40,
                   (int)constraints.
                        super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (default_cost_type<double> *)&cost_constant,(double)slv.m_best._48_8_);
      baryonyx::result::operator=(__return_storage_ptr__,&local_370);
      baryonyx::result::~result(&local_370);
      solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
      ::~solver_functor((solver_functor<baryonyx::itm::solver_equalities_101coeff<double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_false>,_double,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<double>,_baryonyx::none_observer>
                         *)local_2c8);
    }
    default_cost_type<double>::~default_cost_type((default_cost_type<double> *)&cost_constant);
  }
  std::shared_ptr<baryonyx::string_buffer>::operator=
            (&__return_storage_ptr__->strings,(shared_ptr<baryonyx::string_buffer> *)ctx);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&__return_storage_ptr__->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).init_kappa_improve_increase);
  affected_variables::operator=
            (&__return_storage_ptr__->affected_vars,
             (affected_variables *)&(ctx->parameters).pushing_iteration_limit);
  __return_storage_ptr__->variables =
       (int)constraints.
            super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage;
  iVar3 = length<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>>
                    ((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      *)local_40);
  __return_storage_ptr__->constraints = iVar3;
  bVar2 = std::function::operator_cast_to_bool((function *)(this + 0x158));
  if (bVar2) {
    std::function<void_(const_baryonyx::result_&)>::operator()
              ((function<void_(const_baryonyx::result_&)> *)(this + 0x158),__return_storage_ptr__);
  }
  constraints.
  super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector((vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *)local_40);
  if ((constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    baryonyx::result::~result(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result
solve_problem(const context& ctx, const problem& pb)
{
    if (ctx.start)
        ctx.start(ctx.parameters);

    result ret;

    auto variables = length(pb.vars.values);
    auto constraints{ make_merged_constraints(ctx, pb) };

    if (!constraints.empty() && !pb.vars.values.empty()) {
        random_engine rng(init_random_generator_seed(ctx));

        auto cost = Cost(pb.objective, variables);
        auto cost_constant = pb.objective.value;

        switch (ctx.parameters.observer) {
        case solver_parameters::observer_type::pnm: {
            using obs = pnm_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        case solver_parameters::observer_type::file: {
            using obs = file_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
        } break;
        default: {
            using obs = none_observer;

            solver_functor<Solver, Float, Mode, Cost, obs> slv(ctx, rng);
            ret = slv(constraints, variables, cost, cost_constant);
            break;
        }
        }
    } else {
        ret.status = result_status::success;
        ret.solutions.resize(1);
        ret.solutions.back().value = pb.objective.value;
    }

    ret.strings = pb.strings;
    ret.variable_name = std::move(pb.vars.names);
    ret.affected_vars = std::move(pb.affected_vars);
    ret.variables = variables;
    ret.constraints = length(constraints);

    if (ctx.finish)
        ctx.finish(ret);

    return ret;
}